

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void ecs_hash(void *data,ecs_size_t length,uint64_t *result)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  uVar1 = ecs_to_size_t((long)length);
  uVar2 = (int)uVar1 + 0xdeadbeef;
  uVar3 = uVar2;
  uVar6 = uVar2;
  if (((ulong)data & 3) == 0) {
    for (; 0xc < uVar1; uVar1 = uVar1 - 0xc) {
      uVar3 = uVar3 + *(int *)((long)data + 8);
      uVar2 = (uVar3 * 0x10 | uVar3 >> 0x1c) ^ (uVar2 + *data) - uVar3;
      iVar5 = uVar3 + uVar6 + *(int *)((long)data + 4);
      uVar3 = (uVar2 << 6 | uVar2 >> 0x1a) ^ (uVar6 + *(int *)((long)data + 4)) - uVar2;
      iVar4 = uVar2 + iVar5;
      uVar6 = (uVar3 << 8 | uVar3 >> 0x18) ^ iVar5 - uVar3;
      iVar5 = uVar3 + iVar4;
      uVar2 = (uVar6 << 0x10 | uVar6 >> 0x10) ^ iVar4 - uVar6;
      iVar4 = uVar6 + iVar5;
      uVar6 = (uVar2 << 0x13 | uVar2 >> 0xd) ^ iVar5 - uVar2;
      uVar2 = uVar2 + iVar4;
      data = (void *)((long)data + 0xc);
      uVar3 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar4 - uVar6;
      uVar6 = uVar6 + uVar2;
    }
    (*(code *)(&DAT_0013d6a8 + *(int *)(&DAT_0013d6a8 + uVar1 * 4)))(uVar6,uVar3);
    return;
  }
  if (((ulong)data & 1) != 0) {
    for (; 0xc < uVar1; uVar1 = uVar1 - 0xc) {
      iVar4 = (uint)*(byte *)((long)data + 7) * 0x1000000 +
              (uint)*(byte *)((long)data + 6) * 0x10000 +
              (uint)*(byte *)((long)data + 5) * 0x100 + *(byte *)((long)data + 4) + uVar6;
      uVar3 = (uint)*(byte *)((long)data + 0xb) * 0x1000000 +
              (uint)*(byte *)((long)data + 10) * 0x10000 +
              (uint)*(byte *)((long)data + 9) * 0x100 + *(byte *)((long)data + 8) + uVar3;
      uVar2 = (uVar3 * 0x10 | uVar3 >> 0x1c) ^
              ((uint)*(byte *)((long)data + 3) * 0x1000000 +
               (uint)*(byte *)((long)data + 2) * 0x10000 +
              (uint)*(byte *)((long)data + 1) * 0x100 + *data + uVar2) - uVar3;
      iVar5 = uVar3 + iVar4;
      uVar6 = (uVar2 << 6 | uVar2 >> 0x1a) ^ iVar4 - uVar2;
      iVar4 = uVar2 + iVar5;
      uVar3 = (uVar6 << 8 | uVar6 >> 0x18) ^ iVar5 - uVar6;
      iVar5 = uVar6 + iVar4;
      uVar2 = (uVar3 << 0x10 | uVar3 >> 0x10) ^ iVar4 - uVar3;
      iVar4 = uVar3 + iVar5;
      uVar6 = (uVar2 << 0x13 | uVar2 >> 0xd) ^ iVar5 - uVar2;
      uVar2 = uVar2 + iVar4;
      data = (void *)((long)data + 0xc);
      uVar3 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar4 - uVar6;
      uVar6 = uVar6 + uVar2;
    }
    (*(code *)(&DAT_0013d640 + *(int *)(&DAT_0013d640 + uVar1 * 4)))(uVar6,0,uVar3);
    return;
  }
  for (; 0xc < uVar1; uVar1 = uVar1 - 0xc) {
    uVar3 = uVar3 + *(int *)((long)data + 8);
    uVar2 = (uVar3 * 0x10 | uVar3 >> 0x1c) ^ (uVar2 + *data) - uVar3;
    iVar4 = uVar3 + uVar6 + *(int *)((long)data + 4);
    uVar3 = (uVar2 << 6 | uVar2 >> 0x1a) ^ (uVar6 + *(int *)((long)data + 4)) - uVar2;
    iVar5 = uVar2 + iVar4;
    uVar6 = (uVar3 << 8 | uVar3 >> 0x18) ^ iVar4 - uVar3;
    iVar4 = uVar3 + iVar5;
    uVar2 = (uVar6 << 0x10 | uVar6 >> 0x10) ^ iVar5 - uVar6;
    iVar5 = uVar6 + iVar4;
    uVar6 = (uVar2 << 0x13 | uVar2 >> 0xd) ^ iVar4 - uVar2;
    uVar2 = uVar2 + iVar5;
    data = (void *)((long)data + 0xc);
    uVar3 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar5 - uVar6;
    uVar6 = uVar6 + uVar2;
  }
  (*(code *)(&DAT_0013d674 + *(int *)(&DAT_0013d674 + uVar1 * 4)))
            (&DAT_0013d674,0,uVar3,uVar2,uVar6);
  return;
}

Assistant:

void ecs_hash(
    const void *data,
    ecs_size_t length,
    uint64_t *result)
{
    uint32_t h_1 = 0;
    uint32_t h_2 = 0;

    hashlittle2(
        data,
        ecs_to_size_t(length),
        &h_1,
        &h_2);

    *result = h_1 | ((uint64_t)h_2 << 32);
}